

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::
ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
::truncate(ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
           *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  uint *puVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  PipelineHook *pPVar6;
  Disposer *pDVar7;
  int in_EAX;
  int extraout_EAX;
  
  pEVar1 = this->ptr;
  pEVar2 = this->pos;
  while (pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    puVar3 = pEVar2[-1].value.resultExports.ptr;
    if (puVar3 != (uint *)0x0) {
      sVar4 = pEVar2[-1].value.resultExports.size_;
      pEVar2[-1].value.resultExports.ptr = (uint *)0x0;
      pEVar2[-1].value.resultExports.size_ = 0;
      pAVar5 = pEVar2[-1].value.resultExports.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,puVar3,4,sVar4,sVar4,0);
    }
    OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>
    ::destroy(&pEVar2[-1].value.task);
    pPVar6 = pEVar2[-1].value.pipeline.ptr.ptr;
    in_EAX = extraout_EAX;
    if (pPVar6 != (PipelineHook *)0x0) {
      pEVar2[-1].value.pipeline.ptr.ptr = (PipelineHook *)0x0;
      pDVar7 = pEVar2[-1].value.pipeline.ptr.disposer;
      in_EAX = (**pDVar7->_vptr_Disposer)
                         (pDVar7,pPVar6->_vptr_PipelineHook[-2] + (long)&pPVar6->_vptr_PipelineHook)
      ;
    }
    pEVar2 = this->pos;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }